

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::showHelp(Session *this,string *processName)

{
  bool bVar1;
  ostream *poVar2;
  string *processName_local;
  Session *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"\nCatch v");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,libraryVersion);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,DAT_001da494);
  poVar2 = std::operator<<(poVar2," build ");
  std::ostream::operator<<(poVar2,DAT_001da498);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &DAT_001da4a0,"master");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout," (");
    poVar2 = std::operator<<(poVar2,(string *)&DAT_001da4a0);
    std::operator<<(poVar2," branch)");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  Clara::CommandLine<Catch::ConfigData>::usage(&this->m_cli,(ostream *)&std::cout,processName);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "For more detail usage please see the project docs\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void showHelp( std::string const& processName ) {
            std::cout << "\nCatch v"    << libraryVersion.majorVersion << "."
                                        << libraryVersion.minorVersion << " build "
                                        << libraryVersion.buildNumber;
            if( libraryVersion.branchName != "master" )
                std::cout << " (" << libraryVersion.branchName << " branch)";
            std::cout << "\n";

            m_cli.usage( std::cout, processName );
            std::cout << "For more detail usage please see the project docs\n" << std::endl;
        }